

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsnode_bmod.c
# Opt level: O1

int dsnode_bmod(int jcol,int jsupno,int fsupc,double *dense,double *tempv,GlobalLU_t *Glu,
               SuperLUStat_t *stat)

{
  double *rhs;
  int iVar1;
  int iVar2;
  flops_t *pfVar3;
  int_t *piVar4;
  void *pvVar5;
  int_t *piVar6;
  int_t *piVar7;
  ulong uVar8;
  uint nrow;
  int iVar9;
  int iVar10;
  long lVar11;
  
  pfVar3 = stat->ops;
  piVar4 = Glu->xlsub;
  pvVar5 = Glu->lusup;
  piVar6 = Glu->xlusup;
  iVar1 = piVar6[jcol];
  iVar9 = piVar4[fsupc];
  iVar2 = piVar4[(long)fsupc + 1];
  iVar10 = iVar1;
  if (iVar9 < iVar2) {
    piVar7 = Glu->lsub;
    lVar11 = 0;
    do {
      iVar10 = piVar7[iVar9 + lVar11];
      *(double *)((long)pvVar5 + lVar11 * 8 + (long)iVar1 * 8) = dense[iVar10];
      dense[iVar10] = 0.0;
      lVar11 = lVar11 + 1;
    } while ((long)iVar2 - (long)iVar9 != lVar11);
    iVar10 = (int)lVar11 + iVar1;
  }
  piVar6[(long)jcol + 1] = iVar10;
  iVar9 = jcol - fsupc;
  if (iVar9 != 0 && fsupc <= jcol) {
    iVar10 = piVar4[(long)fsupc + 1] - piVar4[fsupc];
    nrow = iVar10 - iVar9;
    iVar2 = piVar6[fsupc];
    pfVar3[0x13] = (float)((iVar9 + -1) * iVar9) + pfVar3[0x13];
    pfVar3[0x14] = (float)(int)(iVar9 * nrow * 2) + pfVar3[0x14];
    rhs = (double *)((long)pvVar5 + (long)iVar1 * 8);
    dlsolve(iVar10,iVar9,(double *)((long)pvVar5 + (long)iVar2 * 8),rhs);
    dmatvec(iVar10,nrow,iVar9,(double *)((long)pvVar5 + ((long)iVar2 + (long)iVar9) * 8),rhs,tempv);
    if (0 < (int)nrow) {
      uVar8 = 0;
      do {
        *(double *)((long)pvVar5 + uVar8 * 8 + (long)(iVar1 + iVar9) * 8) =
             *(double *)((long)pvVar5 + uVar8 * 8 + (long)(iVar1 + iVar9) * 8) - tempv[uVar8];
        tempv[uVar8] = 0.0;
        uVar8 = uVar8 + 1;
      } while (uVar8 < nrow);
    }
  }
  return 0;
}

Assistant:

int
dsnode_bmod (
	    const int  jcol,	  /* in */
	    const int  jsupno,    /* in */
	    const int  fsupc,     /* in */
	    double     *dense,    /* in */
	    double     *tempv,    /* working array */
	    GlobalLU_t *Glu,      /* modified */
	    SuperLUStat_t *stat   /* output */
	    )
{
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int            incx = 1, incy = 1;
    double         alpha = -1.0, beta = 1.0;
#endif

    int     nsupc, nsupr, nrow;
    int_t   isub, irow;
    int_t   ufirst, nextlu;
    int_t   *lsub, *xlsub;
    double *lusup;
    int_t   *xlusup, luptr;
    flops_t *ops = stat->ops;

    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (double *) Glu->lusup;
    xlusup  = Glu->xlusup;

    nextlu = xlusup[jcol];
    
    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
	dense[irow] = 0;
	++nextlu;
    }

    xlusup[jcol + 1] = nextlu;	/* Initialize xlusup for next column */
    
    if ( fsupc < jcol ) {

	luptr = xlusup[fsupc];
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nsupc = jcol - fsupc;	/* Excluding jcol */
	ufirst = xlusup[jcol];	/* Points to the beginning of column
				   jcol in supernode L\U(jsupno). */
	nrow = nsupr - nsupc;

	ops[TRSV] += nsupc * (nsupc - 1);
	ops[GEMV] += 2 * nrow * nsupc;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	STRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	SGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	dtrsv_( "L", "N", "U", &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	dgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	dlsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );
	dmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc], 
			&lusup[ufirst], &tempv[0] );

	int_t i, iptr; 
        /* Scatter tempv[*] into lusup[*] */
	iptr = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    lusup[iptr++] -= tempv[i];
	    tempv[i] = 0.0;
	}
#endif

    }

    return 0;
}